

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strparse.c
# Opt level: O3

int Curl_str_untilnl(char **linep,Curl_str *out,size_t max)

{
  char *pcVar1;
  ulong uVar2;
  uint uVar3;
  
  pcVar1 = *linep;
  out->str = (char *)0x0;
  out->len = 0;
  uVar2 = 0;
  while ((uVar3 = (uint)(byte)pcVar1[uVar2], 0xd < uVar3 || ((0x2401U >> (uVar3 & 0x1f) & 1) == 0)))
  {
    uVar2 = uVar2 + 1;
    if (max < uVar2) {
      return 1;
    }
  }
  if (uVar2 != 0) {
    out->str = *linep;
    out->len = uVar2;
    *linep = pcVar1 + uVar2;
    return 0;
  }
  return 2;
}

Assistant:

int Curl_str_untilnl(const char **linep, struct Curl_str *out,
                     const size_t max)
{
  const char *s = *linep;
  size_t len = 0;
  DEBUGASSERT(linep && *linep && out && max);

  Curl_str_init(out);
  while(*s && !ISNEWLINE(*s)) {
    s++;
    if(++len > max)
      return STRE_BIG;
  }
  if(!len)
    return STRE_SHORT;
  out->str = *linep;
  out->len = len;
  *linep = s; /* point to the first byte after the word */
  return STRE_OK;
}